

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerHLSL::to_initializer_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRVariable *var)

{
  Variant *pVVar1;
  bool bVar2;
  SPIRType *pSVar3;
  ulong uVar4;
  SPIRConstant *c;
  
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  bVar2 = Compiler::has_decoration((Compiler *)this,(ID)(pSVar3->super_IVariant).self.id,Block);
  uVar4 = (ulong)(var->initializer).id;
  if ((uVar4 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar4].type == TypeConstant)) {
    c = Variant::get<spirv_cross::SPIRConstant>(pVVar1 + uVar4);
  }
  else {
    c = (SPIRConstant *)0x0;
  }
  if (bVar2 && c != (SPIRConstant *)0x0) {
    CompilerGLSL::constant_expression_abi_cxx11_
              (__return_storage_ptr__,&this->super_CompilerGLSL,c,false,false);
  }
  else {
    CompilerGLSL::to_initializer_expression_abi_cxx11_
              (__return_storage_ptr__,&this->super_CompilerGLSL,var);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerHLSL::to_initializer_expression(const SPIRVariable &var)
{
	// We cannot emit static const initializer for block constants for practical reasons,
	// so just inline the initializer.
	// FIXME: There is a theoretical problem here if someone tries to composite extract
	// into this initializer since we don't declare it properly, but that is somewhat non-sensical.
	auto &type = get<SPIRType>(var.basetype);
	bool is_block = has_decoration(type.self, DecorationBlock);
	auto *c = maybe_get<SPIRConstant>(var.initializer);
	if (is_block && c)
		return constant_expression(*c);
	else
		return CompilerGLSL::to_initializer_expression(var);
}